

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::SingleLineUnboundLayoutProducesSingleGlyphRuns(LayoutTests *this)

{
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  long lVar1;
  undefined1 *puVar2;
  positioned_glyph *ppVar3;
  byte bVar4;
  allocator local_4d9;
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_4d8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_4c0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_4a8;
  ref_glyph_run local_490;
  string local_458;
  ref_text_line local_438;
  factory_ptr f1;
  LocationInfo local_400;
  factory_ptr f2;
  positioned_glyph reference4 [1];
  positioned_glyph reference2 [3];
  positioned_glyph reference5 [9];
  positioned_glyph reference3 [3];
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  char_to_index indices2 [4];
  positioned_glyph reference1 [1];
  layout l5;
  layout l4;
  layout l3;
  layout l2;
  layout l1;
  char_to_index indices1 [3];
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_b8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar4 = 0;
  indices1[0].symbol = 0x41;
  indices1[0].index = 1;
  indices1[1].symbol = 0x42;
  indices1[1].index = 0;
  indices1[2].symbol = 0x51;
  indices1[2].index = 0;
  indices2[2].symbol = 0x51;
  indices2[2].index = 2;
  indices2[3].symbol = 0x20;
  indices2[3].index = 3;
  indices2[0].symbol = 0x41;
  indices2[0].index = 0;
  indices2[1].symbol = 0x42;
  indices2[1].index = 1;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x402a000000000000;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x4026000000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0x4029666666666666;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x4024333333333333;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<3ul,4ul>
            ((LayoutTests *)&f1,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [4])indices1);
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)&f2,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm2,(glyph (*) [4])indices2);
  layout::layout(&l1);
  layout::layout(&l2);
  layout::layout(&l3);
  layout::layout(&l4);
  layout::layout(&l5);
  std::__cxx11::string::string((string *)&local_490,"A",(allocator *)&local_438);
  R((richtext_t *)reference5,(string *)&local_490);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l1,reference5,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference5);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string((string *)&local_490,"AAB",(allocator *)&local_438);
  R((richtext_t *)reference5,(string *)&local_490);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l2,reference5,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference5);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string((string *)&local_490,"BQA",(allocator *)&local_438);
  R((richtext_t *)reference5,(string *)&local_490);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l3,reference5,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference5);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string((string *)&local_490,"A",(allocator *)&local_438);
  R((richtext_t *)reference5,(string *)&local_490);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l4,reference5,
             f2.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference5);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string((string *)&local_490,"ABQ A  QA",(allocator *)&local_438);
  R((richtext_t *)reference5,(string *)&local_490);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l5,reference5,
             f2.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference5);
  std::__cxx11::string::~string((string *)&local_490);
  reference1[0].index = 1;
  reference1[0].d.dx = 11.0;
  reference1[0].d.dy = 0.0;
  reference2[2].d.dy = 0.0;
  reference2[0].index = 1;
  reference2[0].d.dx = 11.0;
  reference2[0].d.dy = 0.0;
  reference2[1].index = 1;
  reference2[1].d.dx = 11.0;
  reference2[1].d.dy = 0.0;
  reference2[2].index = 0;
  reference2[2].d.dx = 13.0;
  reference3[0].d.dy = 0.0;
  reference3[1].index = 0;
  reference3[2].d.dy = 0.0;
  reference3[0].index = 0;
  reference3[0].d.dx = 13.0;
  reference3[1].d.dx = 13.0;
  reference3[1].d.dy = 0.0;
  reference3[2].index = 1;
  reference3[2].d.dx = 11.0;
  reference4[0].index = 0;
  reference4[0].d.dx = 13.0;
  reference4[0].d.dy = 0.0;
  puVar2 = &DAT_001a45d0;
  ppVar3 = reference5;
  for (end._M_current = (text_line *)0x6c; end._M_current != (text_line *)0x0;
      end._M_current = (text_line *)((long)&end._M_current[-1].descent + 3)) {
    *(undefined1 *)&ppVar3->index = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    ppVar3 = (positioned_glyph *)((long)ppVar3 + (ulong)bVar4 * -2 + 1);
  }
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2a8,
             &((f1.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<1ul>
            (&local_490,(shared_ptr<agge::font> *)&local_2a8,0.0,0.0,&reference1);
  plural_::operator+(&local_4c0,(plural_ *)&plural,&local_490);
  ref_text_line::ref_text_line(&local_438,0.0,10.0,0.0,&local_4c0);
  plural_::operator+(&local_4a8,(plural_ *)&plural,&local_438);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             (tests *)l1._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l1._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_458,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_4d9);
  ut::LocationInfo::LocationInfo(&local_400,&local_458,0xa5);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4a8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_458);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_4d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_438._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4c0);
  ref_glyph_run::~ref_glyph_run(&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2b8,
             &((f1.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<3ul>
            (&local_490,(shared_ptr<agge::font> *)&local_2b8,0.0,0.0,&reference2);
  plural_::operator+(&local_4c0,(plural_ *)&plural,&local_490);
  ref_text_line::ref_text_line(&local_438,0.0,10.0,0.0,&local_4c0);
  plural_::operator+(&local_4a8,(plural_ *)&plural,&local_438);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             (tests *)l2._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l2._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_458,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_4d9);
  ut::LocationInfo::LocationInfo(&local_400,&local_458,0xa8);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4a8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_458);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_4d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_438._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4c0);
  ref_glyph_run::~ref_glyph_run(&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2c8,
             &((f1.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<3ul>
            (&local_490,(shared_ptr<agge::font> *)&local_2c8,0.0,0.0,&reference3);
  plural_::operator+(&local_4c0,(plural_ *)&plural,&local_490);
  ref_text_line::ref_text_line(&local_438,0.0,10.0,0.0,&local_4c0);
  plural_::operator+(&local_4a8,(plural_ *)&plural,&local_438);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             (tests *)l3._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l3._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_458,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_4d9);
  ut::LocationInfo::LocationInfo(&local_400,&local_458,0xab);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4a8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_458);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_4d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_438._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4c0);
  ref_glyph_run::~ref_glyph_run(&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2d8,
             &((f2.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<1ul>
            (&local_490,(shared_ptr<agge::font> *)&local_2d8,0.0,0.0,&reference4);
  plural_::operator+(&local_4c0,(plural_ *)&plural,&local_490);
  ref_text_line::ref_text_line(&local_438,0.0,14.0,0.0,&local_4c0);
  plural_::operator+(&local_4a8,(plural_ *)&plural,&local_438);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             (tests *)l4._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l4._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_458,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_4d9);
  ut::LocationInfo::LocationInfo(&local_400,&local_458,0xae);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4a8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_458);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_4d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_438._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4c0);
  ref_glyph_run::~ref_glyph_run(&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2e8,
             &((f2.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<9ul>
            (&local_490,(shared_ptr<agge::font> *)&local_2e8,0.0,0.0,&reference5);
  plural_::operator+(&local_4c0,(plural_ *)&plural,&local_490);
  ref_text_line::ref_text_line(&local_438,0.0,14.0,0.0,&local_4c0);
  plural_::operator+(&local_4a8,(plural_ *)&plural,&local_438);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             (tests *)l5._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l5._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_458,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_4d9);
  ut::LocationInfo::LocationInfo(&local_400,&local_458,0xb1);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_4a8,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4d8,
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_458);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_4d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_4a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_438._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_4c0);
  ref_glyph_run::~ref_glyph_run(&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8._M_refcount);
  layout::~layout(&l5);
  layout::~layout(&l4);
  layout::~layout(&l3);
  layout::~layout(&l2);
  layout::~layout(&l1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f2.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f1.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar1 = 0x88;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_b8._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( SingleLineUnboundLayoutProducesSingleGlyphRuns )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 1 }, { L'Q', 2 }, { L' ', 3 } };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
					{ { 12.7, 0 } },
					{ { 10.1, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices2, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;
				layout l4;
				layout l5;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);
				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQ A  QA"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference1[] = { { 1, { 11.0f, 0.0f } } };
				positioned_glyph reference2[] = { { 1, { 11.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference3[] = { { 0, { 13.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, };
				positioned_glyph reference4[] = { { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference5[] = {
					{ 0, { 13.0f, 0.0f } },
					{ 1, { 11.0f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
				};

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference2)),
					mkvector(l2.begin(), l2.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference3)),
					mkvector(l3.begin(), l3.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference4)),
					mkvector(l4.begin(), l4.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference5)),
					mkvector(l5.begin(), l5.end()));
			}